

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_picker.cpp
# Opt level: O0

int __thiscall libtorrent::aux::hash_picker::layers_to_verify(hash_picker *this,node_index idx)

{
  bool bVar1;
  int iVar2;
  uint idx_00;
  value_type *this_00;
  value_type *tree;
  int local_24;
  int file_internal_layers;
  int layers;
  hash_picker *this_local;
  int iStack_10;
  node_index idx_local;
  
  iStack_10 = idx.node;
  if (iStack_10 == 0) {
    idx_local.file.m_val = -1;
  }
  else {
    local_24 = 0;
    this_local._4_4_ = idx.file.m_val;
    iVar2 = file_storage::file_num_pieces(this->m_files,this_local._4_4_);
    iVar2 = merkle_num_leafs(iVar2);
    iVar2 = merkle_num_layers(iVar2);
    this_00 = container_wrapper<libtorrent::aux::merkle_tree,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>_>
              ::operator[](this->m_merkle_trees,
                           (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                           this_local._4_4_);
    unique0x1000009c = idx;
    do {
      idx_00 = merkle_get_parent(iStack_10);
      stack0xffffffffffffffec = (node_index)((ulong)idx_00 << 0x20);
      bVar1 = merkle_tree::has_node(this_00,idx_00);
      if (bVar1) {
        return local_24;
      }
      local_24 = local_24 + 1;
      idx_local.file.m_val = local_24;
    } while (local_24 != iVar2 + -1);
  }
  return idx_local.file.m_val;
}

Assistant:

int hash_picker::layers_to_verify(node_index idx) const
	{
		// the root layer doesn't have a sibling so it should never
		// be requested as a proof layer
		// return -1 to signal to the caller that no proof is required
		// even for the first layer it is trying to verify
		if (idx.node == 0) return -1;

		int layers = 0;
		int const file_internal_layers = merkle_num_layers(merkle_num_leafs(m_files.file_num_pieces(idx.file))) - 1;
		auto const& tree = m_merkle_trees[idx.file];

		for (;;)
		{
			idx.node = merkle_get_parent(idx.node);
			if (tree.has_node(idx.node)) break;
			layers++;
			if (layers == file_internal_layers) return layers;
		}

		return layers;
	}